

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evaluator.c
# Opt level: O3

Value * apply_division_operation(Value *left_value,Value *right_value,_Bool is_integer_division)

{
  Value *pVVar1;
  longdouble lVar2;
  longdouble lVar3;
  double dVar4;
  double dVar5;
  
  if (((left_value->value_type & ~ValueTypeBoolValue) != ValueTypeIntegerValue) ||
     ((right_value->value_type & ~ValueTypeBoolValue) != ValueTypeIntegerValue)) {
    pVVar1 = new_null_value();
    return pVVar1;
  }
  if (left_value->value_type == ValueTypeFloatValue) {
    lVar3 = *(longdouble *)&left_value[1].linked_variable_count;
  }
  else {
    lVar3 = (longdouble)*(long *)(left_value + 1);
  }
  if (right_value->value_type == ValueTypeFloatValue) {
    lVar2 = *(longdouble *)&right_value[1].linked_variable_count;
  }
  else {
    lVar2 = (longdouble)*(long *)(right_value + 1);
  }
  lVar3 = lVar3 / lVar2;
  if (!is_integer_division) {
    dVar4 = ceil((double)lVar3);
    dVar5 = floor((double)lVar3);
    if ((dVar4 != dVar5) || (NAN(dVar4) || NAN(dVar5))) {
      pVVar1 = new_float_value(lVar3);
      return pVVar1;
    }
  }
  pVVar1 = new_integer_value((long)ROUND(lVar3));
  return pVVar1;
}

Assistant:

Value *apply_division_operation(Value *left_value, Value *right_value, bool is_integer_division) {
  if ((left_value->value_type == ValueTypeIntegerValue || left_value->value_type == ValueTypeFloatValue) && (right_value->value_type == ValueTypeIntegerValue || right_value->value_type == ValueTypeFloatValue)) {
    long double left_float, right_float, result;

    if (left_value->value_type == ValueTypeFloatValue) left_float = ((FloatValue *) left_value)->float_value;
    else left_float = ((IntegerValue *) left_value)->integer_value;

    if (right_value->value_type == ValueTypeFloatValue) right_float = ((FloatValue *) right_value)->float_value;
    else right_float = ((IntegerValue *) right_value)->integer_value;

    result = left_float / right_float;

    if (is_integer_division || ceil(result) == floor(result)) {
      return new_integer_value((long long int) result);
    }
    else {
      return new_float_value(result);
    }
  }

  return new_null_value();
}